

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_openbyindex(zip_t *zip,size_t index)

{
  ushort uVar1;
  mz_bool mVar2;
  long lVar3;
  char *pcVar4;
  char *pFilename;
  mz_uint8 *pHeader;
  undefined1 local_480 [4];
  mz_uint namelen;
  mz_zip_archive_file_stat stats;
  mz_zip_archive *pZip;
  size_t index_local;
  zip_t *zip_local;
  
  if (zip == (zip_t *)0x0) {
    zip_local._4_4_ = -1;
  }
  else if ((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) {
    if (index < (zip->archive).m_total_files) {
      lVar3 = (long)(((zip->archive).m_pState)->m_central_dir).m_p +
              (ulong)*(uint *)((long)(((zip->archive).m_pState)->m_central_dir_offsets).m_p +
                              index * 4);
      if (lVar3 == 0) {
        zip_local._4_4_ = -0xb;
      }
      else {
        uVar1 = *(ushort *)(lVar3 + 0x1c);
        stats.m_time = (time_t)zip;
        if (((zip->entry).name != (char *)0x0) && ((zip->entry).name != (char *)0x0)) {
          free((zip->entry).name);
          (zip->entry).name = (char *)0x0;
        }
        pcVar4 = zip_strclone((char *)(lVar3 + 0x2e),(ulong)uVar1);
        (zip->entry).name = pcVar4;
        if ((zip->entry).name == (char *)0x0) {
          zip_local._4_4_ = -2;
        }
        else {
          mVar2 = mz_zip_reader_file_stat
                            ((mz_zip_archive *)stats.m_time,(mz_uint)index,
                             (mz_zip_archive_file_stat *)local_480);
          if (mVar2 == 0) {
            zip_local._4_4_ = -3;
          }
          else {
            (zip->entry).index = index;
            (zip->entry).comp_size = stats._24_8_;
            (zip->entry).uncomp_size = stats.m_comp_size;
            (zip->entry).uncomp_crc32 = stats._16_4_;
            (zip->entry).dir_offset = stats._0_8_;
            (zip->entry).header_offset = stats._48_8_;
            (zip->entry).method = stats.m_central_dir_ofs._6_2_;
            (zip->entry).external_attr = stats.m_uncomp_size._4_4_;
            (zip->entry).m_time = stats.m_comment._504_8_;
            zip_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      zip_local._4_4_ = -10;
    }
  }
  else {
    zip_local._4_4_ = -4;
  }
  return zip_local._4_4_;
}

Assistant:

int zip_entry_openbyindex(struct zip_t *zip, size_t index) {
  mz_zip_archive *pZip = NULL;
  mz_zip_archive_file_stat stats;
  mz_uint namelen;
  const mz_uint8 *pHeader;
  const char *pFilename;

  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  pZip = &(zip->archive);
  if (pZip->m_zip_mode != MZ_ZIP_MODE_READING) {
    // open by index requires readonly mode
    return ZIP_EINVMODE;
  }

  if (index >= (size_t)pZip->m_total_files) {
    // index out of range
    return ZIP_EINVIDX;
  }

  if (!(pHeader = &MZ_ZIP_ARRAY_ELEMENT(
            &pZip->m_pState->m_central_dir, mz_uint8,
            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                 mz_uint32, index)))) {
    // cannot find header in central directory
    return ZIP_ENOHDR;
  }

  namelen = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;

  if (zip->entry.name) {
    CLEANUP(zip->entry.name);
  }

  zip->entry.name = zip_strclone(pFilename, namelen);
  if (!zip->entry.name) {
    // local entry name is NULL
    return ZIP_EINVENTNAME;
  }

  if (!mz_zip_reader_file_stat(pZip, (mz_uint)index, &stats)) {
    return ZIP_ENOENT;
  }

  zip->entry.index = (ssize_t)index;
  zip->entry.comp_size = stats.m_comp_size;
  zip->entry.uncomp_size = stats.m_uncomp_size;
  zip->entry.uncomp_crc32 = stats.m_crc32;
  zip->entry.dir_offset = stats.m_central_dir_ofs;
  zip->entry.header_offset = stats.m_local_header_ofs;
  zip->entry.method = stats.m_method;
  zip->entry.external_attr = stats.m_external_attr;
#ifndef MINIZ_NO_TIME
  zip->entry.m_time = stats.m_time;
#endif

  return 0;
}